

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sasl_frame_codec.c
# Opt level: O3

void sasl_frame_codec_destroy(SASL_FRAME_CODEC_HANDLE sasl_frame_codec)

{
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  
  if (sasl_frame_codec != (SASL_FRAME_CODEC_HANDLE)0x0) {
    frame_codec_unsubscribe(sasl_frame_codec->frame_codec,'\x01');
    amqpvalue_decoder_destroy(sasl_frame_codec->decoder);
    free(sasl_frame_codec);
    return;
  }
  UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
  if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
    (*UNRECOVERED_JUMPTABLE)
              (AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/sasl_frame_codec.c"
               ,"sasl_frame_codec_destroy",0xdb,1,"NULL sasl_frame_codec");
    return;
  }
  return;
}

Assistant:

void sasl_frame_codec_destroy(SASL_FRAME_CODEC_HANDLE sasl_frame_codec)
{
    /* Codes_SRS_SASL_FRAME_CODEC_01_026: [If sasl_frame_codec is NULL, sasl_frame_codec_destroy shall do nothing.] */
    if (sasl_frame_codec == NULL)
    {
        LogError("NULL sasl_frame_codec");
    }
    else
    {
        /* Codes_SRS_SASL_FRAME_CODEC_01_025: [sasl_frame_codec_destroy shall free all resources associated with the sasl_frame_codec instance.] */
        SASL_FRAME_CODEC_INSTANCE* sasl_frame_codec_instance = (SASL_FRAME_CODEC_INSTANCE*)sasl_frame_codec;

        /* Codes_SRS_SASL_FRAME_CODEC_01_027: [sasl_frame_codec_destroy shall unsubscribe from receiving SASL frames from the frame_codec that was passed to sasl_frame_codec_create.] */
        (void)frame_codec_unsubscribe(sasl_frame_codec_instance->frame_codec, FRAME_TYPE_SASL);

        /* Codes_SRS_SASL_FRAME_CODEC_01_028: [The decoder created in sasl_frame_codec_create shall be destroyed by sasl_frame_codec_destroy.] */
        amqpvalue_decoder_destroy(sasl_frame_codec_instance->decoder);
        free(sasl_frame_codec_instance);
    }
}